

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<float,_3,_4,_0,_3,_4> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,3,4,0,3,4>>::
_set_noalias<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>>
          (PlainObjectBase<Eigen::Matrix<float,3,4,0,3,4>> *this,
          DenseBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *other)

{
  Matrix<float,_3,_4,_0,_3,_4> *pMVar1;
  Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *src;
  assign_op<float,_float> local_19;
  EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *local_18;
  DenseBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *other_local;
  PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *this_local;
  
  local_18 = (EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *)
             other;
  other_local = (DenseBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_> *)
                this;
  pMVar1 = EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::derived
                     ((EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)this);
  src = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>::derived
                  (local_18);
  internal::assign_op<float,_float>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<float,3,4,0,3,4>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>,Eigen::internal::assign_op<float,float>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>::derived
                     ((EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }